

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O2

void nn_atcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  int iVar2;
  
  if (type == -3 && src == -2) {
    iVar2 = nn_stcp_isidle((nn_stcp *)&self[8].stopped);
    if (iVar2 == 0) {
      nn_epbase_stat_increment((nn_epbase *)self[1].shutdown_fn,0x67,1);
      nn_stcp_stop((nn_stcp *)&self[8].stopped);
    }
    *(undefined4 *)&self[1].fn = 7;
LAB_00124054:
    iVar2 = nn_stcp_isidle((nn_stcp *)&self[8].stopped);
    if (iVar2 == 0) {
      return;
    }
    nn_usock_stop((nn_usock *)&self[1].state);
    *(undefined4 *)&self[1].fn = 8;
  }
  else {
    uVar1 = *(uint *)&self[1].fn;
    if (uVar1 != 8) {
      if (uVar1 != 7) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)uVar1,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
                ,0x89);
        goto LAB_00124016;
      }
      goto LAB_00124054;
    }
  }
  iVar2 = nn_usock_isidle((nn_usock *)&self[1].state);
  if (iVar2 == 0) {
    return;
  }
  if ((nn_usock *)self[8].srcptr != (nn_usock *)0x0) {
    if (self[8].ctx == (nn_ctx *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","atcp->listener_owner.fsm",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
              ,0x7e);
LAB_00124016:
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_swap_owner((nn_usock *)self[8].srcptr,(nn_fsm_owner *)&self[8].owner);
    self[8].srcptr = (void *)0x0;
    *(undefined4 *)&self[8].owner = 0xffffffff;
    self[8].ctx = (nn_ctx *)0x0;
  }
  *(undefined4 *)&self[1].fn = 1;
  nn_fsm_stopped(self,0x85b9);
  return;
}

Assistant:

static void nn_atcp_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_atcp *atcp;

    atcp = nn_cont (self, struct nn_atcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_stcp_isidle (&atcp->stcp)) {
            nn_epbase_stat_increment (atcp->epbase,
                NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_stcp_stop (&atcp->stcp);
        }
        atcp->state = NN_ATCP_STATE_STOPPING_STCP_FINAL;
    }
    if (nn_slow (atcp->state == NN_ATCP_STATE_STOPPING_STCP_FINAL)) {
        if (!nn_stcp_isidle (&atcp->stcp))
            return;
        nn_usock_stop (&atcp->usock);
        atcp->state = NN_ATCP_STATE_STOPPING;
    }
    if (nn_slow (atcp->state == NN_ATCP_STATE_STOPPING)) {
        if (!nn_usock_isidle (&atcp->usock))
            return;
       if (atcp->listener) {
            nn_assert (atcp->listener_owner.fsm);
            nn_usock_swap_owner (atcp->listener, &atcp->listener_owner);
            atcp->listener = NULL;
            atcp->listener_owner.src = -1;
            atcp->listener_owner.fsm = NULL;
        }
        atcp->state = NN_ATCP_STATE_IDLE;
        nn_fsm_stopped (&atcp->fsm, NN_ATCP_STOPPED);
        return;
    }

    nn_fsm_bad_action(atcp->state, src, type);
}